

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::OnTimer(RWSocket *this)

{
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  CppNetBase *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  shared_ptr<cppnet::RWSocket> sStack_28;
  
  if (((this->_connecting)._M_base._M_i & 1U) != 0) {
    __connecting_socket_map::__tls_init();
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(*in_FS_OFFSET + -0x80),&(this->super_Socket)._sock);
    iVar3 = (*(this->super_Socket)._vptr_Socket[2])(this);
    bVar2 = CheckConnect(CONCAT44(extraout_var,iVar3));
    UNRECOVERED_JUMPTABLE = (this->super_Socket)._vptr_Socket[0x10];
    if (bVar2) {
      uVar4 = 0;
    }
    else {
      uVar4 = 3;
    }
    (*UNRECOVERED_JUMPTABLE)(this,uVar4,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  this_01 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_01->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar2 = iVar3 == iVar1;
      if (bVar2) {
        this_01->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar2);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = this_01->_M_use_count == 0;
  }
  this_00 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_00 == (CppNetBase *)0x0 | bVar2)) {
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    CppNetBase::OnTimer(this_00,&sStack_28);
    if (sStack_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void RWSocket::OnTimer() {
    if (_connecting) {
        __connecting_socket_map.erase(_sock);
        if (CheckConnect(GetSocket())) {
            OnConnect(CEC_SUCCESS);
        } else {
            OnConnect(CEC_CONNECT_REFUSE);
        }
        return;
    }
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return;
    }
    cppnet_base->OnTimer(shared_from_this());
}